

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

int32_t interleavedBinarySearch(rle16_t *array,int32_t lenarray,uint16_t ikey)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  
  if (lenarray < 1) {
    return -1;
  }
  iVar3 = lenarray + -1;
  uVar2 = 0;
  do {
    uVar1 = uVar2 + iVar3 >> 1;
    if (array[uVar1].value < ikey) {
      uVar2 = uVar1 + 1;
    }
    else {
      if (array[uVar1].value <= ikey) {
        return uVar1;
      }
      iVar3 = uVar1 - 1;
    }
  } while ((int)uVar2 <= iVar3);
  return ~uVar2;
}

Assistant:

inline int32_t interleavedBinarySearch(const rle16_t *array, int32_t lenarray,
                                       uint16_t ikey) {
    int32_t low = 0;
    int32_t high = lenarray - 1;
    while (low <= high) {
        int32_t middleIndex = (low + high) >> 1;
        uint16_t middleValue = array[middleIndex].value;
        if (middleValue < ikey) {
            low = middleIndex + 1;
        } else if (middleValue > ikey) {
            high = middleIndex - 1;
        } else {
            return middleIndex;
        }
    }
    return -(low + 1);
}